

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

POMCPPrior * __thiscall despot::Adventurer::CreatePOMCPPrior(Adventurer *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  string *name_local;
  Adventurer *this_local;
  
  bVar1 = std::operator==(name,"UNIFORM");
  if (bVar1) {
    this_local = (Adventurer *)operator_new(0x78);
    despot::UniformPOMCPPrior::UniformPOMCPPrior((UniformPOMCPPrior *)this_local,(DSPOMDP *)this);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"RIGHT");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported POMCP prior: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
    }
    this_local = (Adventurer *)operator_new(0x80);
    AdventurerPOMCPPrior::AdventurerPOMCPPrior((AdventurerPOMCPPrior *)this_local,(DSPOMDP *)this);
  }
  return (POMCPPrior *)this_local;
}

Assistant:

POMCPPrior* Adventurer::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM") {
		return new UniformPOMCPPrior(this);
	} else if (name == "DEFAULT" || name == "RIGHT") {
		return new AdventurerPOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}